

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Tokenizer::Refresh(Tokenizer *this)

{
  char cVar1;
  int iVar2;
  void *data;
  char *local_20;
  
  if (this->read_error_ == true) {
    this->current_char_ = '\0';
  }
  else {
    if ((this->record_target_ != (string *)0x0) && (this->record_start_ < this->buffer_size_)) {
      std::__cxx11::string::append
                ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
      this->record_start_ = 0;
    }
    local_20 = (char *)0x0;
    this->buffer_ = (char *)0x0;
    this->buffer_pos_ = 0;
    do {
      iVar2 = (*this->input_->_vptr_ZeroCopyInputStream[2])
                        (this->input_,&local_20,&this->buffer_size_);
      if ((char)iVar2 == '\0') {
        this->buffer_size_ = 0;
        this->read_error_ = true;
        cVar1 = '\0';
        goto LAB_005f8014;
      }
    } while (this->buffer_size_ == 0);
    this->buffer_ = local_20;
    cVar1 = *local_20;
LAB_005f8014:
    this->current_char_ = cVar1;
  }
  return;
}

Assistant:

void Tokenizer::Refresh() {
  if (read_error_) {
    current_char_ = '\0';
    return;
  }

  // If we're in a token, append the rest of the buffer to it.
  if (record_target_ != NULL && record_start_ < buffer_size_) {
    record_target_->append(buffer_ + record_start_, buffer_size_ - record_start_);
    record_start_ = 0;
  }

  const void* data = NULL;
  buffer_ = NULL;
  buffer_pos_ = 0;
  do {
    if (!input_->Next(&data, &buffer_size_)) {
      // end of stream (or read error)
      buffer_size_ = 0;
      read_error_ = true;
      current_char_ = '\0';
      return;
    }
  } while (buffer_size_ == 0);

  buffer_ = static_cast<const char*>(data);

  current_char_ = buffer_[0];
}